

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int * Gia_ManCreateMuxRefs(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  iVar1 = p->nObjs;
  piVar2 = (int *)calloc((long)iVar1,4);
  if (0 < (long)iVar1) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return piVar2;
      }
      pGVar5 = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar4);
      iVar1 = Gia_ObjRecognizeExor(pGVar5,&local_38,&local_40);
      if ((iVar1 == 0) && (iVar1 = Gia_ObjIsMuxType(pGVar5), iVar1 != 0)) {
        pGVar3 = Gia_ObjRecognizeMux(pGVar5,&local_38,&local_40);
        pGVar3 = (Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe);
        pGVar5 = p->pObjs;
        if ((pGVar3 < pGVar5) || (pGVar5 + p->nObjs <= pGVar3)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar2[(int)((ulong)((long)pGVar3 - (long)pGVar5) >> 2) * -0x55555555] =
             piVar2[(int)((ulong)((long)pGVar3 - (long)pGVar5) >> 2) * -0x55555555] + 1;
      }
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar6 < p->nObjs);
  }
  return piVar2;
}

Assistant:

int * Gia_ManCreateMuxRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj, * pCtrl, * pFan0, * pFan1;
    int i, * pMuxRefs;
    pMuxRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjRecognizeExor( pObj, &pFan0, &pFan1 ) )
            continue;
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pCtrl = Gia_ObjRecognizeMux( pObj, &pFan0, &pFan1 );
        pMuxRefs[ Gia_ObjId(p, Gia_Regular(pCtrl)) ]++;
    }
    return pMuxRefs;
}